

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O3

bool __thiscall
crnlib::dxt1_endpoint_optimizer::evaluate_solution_hc_perceptual
          (dxt1_endpoint_optimizer *this,dxt1_solution_coordinates *coords,bool alternate_rounding)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  dxt1_solution_coordinates dVar5;
  unique_color *puVar6;
  uint uVar7;
  uint16 uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint64 uVar18;
  ulong uVar19;
  bool bVar20;
  color_quad_u8 c1;
  color_quad_u8 c0;
  undefined1 local_7c [5];
  byte local_77;
  byte local_76;
  uint local_50;
  uint local_48;
  uint local_40;
  uint local_38;
  
  dxt1_block::unpack_color((dxt1_block *)(local_7c + 4),coords->m_low_color,true,0xff);
  dxt1_block::unpack_color((dxt1_block *)local_7c,coords->m_high_color,true,0xff);
  uVar4 = (this->m_evaluated_colors).m_size;
  if (uVar4 == 0) {
    uVar18 = (this->m_best_solution).m_error;
    uVar19 = 0;
  }
  else {
    uVar11 = (uint)local_7c[0];
    puVar6 = (this->m_evaluated_colors).m_p;
    uVar7 = (uint)alternate_rounding;
    uVar18 = (this->m_best_solution).m_error;
    uVar19 = 0;
    lVar10 = 0;
    do {
      bVar1 = puVar6[lVar10].m_color.field_0.field_0.r;
      bVar2 = puVar6[lVar10].m_color.field_0.field_0.g;
      bVar3 = puVar6[lVar10].m_color.field_0.field_0.b;
      uVar12 = (uint)bVar3;
      iVar15 = (uint)bVar1 - (uint)local_7c[4];
      local_38 = (uint)local_77;
      iVar13 = bVar2 - local_38;
      local_48 = (uint)local_76;
      uVar9 = (uVar12 - local_48) * (uVar12 - local_48) +
              iVar13 * iVar13 * 0x19 + iVar15 * iVar15 * 8;
      iVar13 = bVar1 - uVar11;
      local_40 = (uint)local_7c[1];
      iVar15 = bVar2 - local_40;
      local_50 = (uint)local_7c[2];
      iVar16 = bVar3 - local_50;
      uVar17 = iVar16 * iVar16 + iVar15 * iVar15 * 0x19 + iVar13 * iVar13 * 8;
      if (uVar9 < uVar17) {
        uVar17 = uVar9;
      }
      iVar13 = (uint)bVar1 - (uVar7 + uVar11 + (uint)local_7c[4] * 2) / 3;
      iVar15 = (uint)bVar2 - (local_7c[1] + uVar7 + (uint)local_77 * 2) / 3;
      iVar16 = uVar12 - (local_7c[2] + uVar7 + (uint)local_76 * 2) / 3;
      uVar14 = iVar16 * iVar16 + iVar15 * iVar15 * 0x19 + iVar13 * iVar13 * 8;
      iVar16 = (uint)bVar1 - (local_7c[4] + uVar7 + uVar11 * 2) / 3;
      iVar13 = (uint)bVar2 - ((uint)local_77 + (uint)alternate_rounding + (uint)local_7c[1] * 2) / 3
      ;
      iVar15 = uVar12 - ((uint)local_76 + (uint)alternate_rounding + (uint)local_7c[2] * 2) / 3;
      uVar9 = iVar15 * iVar15 + iVar13 * iVar13 * 0x19 + iVar16 * iVar16 * 8;
      if (uVar14 < uVar9) {
        uVar9 = uVar14;
      }
      if (uVar17 < uVar9) {
        uVar9 = uVar17;
      }
      uVar19 = (ulong)puVar6[lVar10].m_weight * (ulong)uVar9 + uVar19;
    } while ((uVar19 < uVar18) && (iVar13 = (int)lVar10, lVar10 = lVar10 + 1, uVar4 - 1 != iVar13));
  }
  if (uVar19 < uVar18) {
    dVar5 = *coords;
    (this->m_best_solution).m_coords = dVar5;
    (this->m_best_solution).m_error = uVar19;
    (this->m_best_solution).m_alpha_block = false;
    (this->m_best_solution).m_alternate_rounding = alternate_rounding;
    uVar8 = dVar5.m_low_color;
    bVar20 = uVar8 == dVar5.m_high_color;
    (this->m_best_solution).m_enforce_selector = bVar20;
    if (bVar20) {
      bVar20 = (~(uint)dVar5 & 0x1f) != 0;
      if (bVar20) {
        (this->m_best_solution).m_coords.m_low_color = uVar8 + 1;
      }
      else {
        (this->m_best_solution).m_coords.m_high_color = uVar8 - 1;
      }
      (this->m_best_solution).m_enforced_selector = bVar20;
    }
  }
  return uVar19 < uVar18;
}

Assistant:

bool dxt1_endpoint_optimizer::evaluate_solution_hc_perceptual(const dxt1_solution_coordinates& coords, bool alternate_rounding)
    {
        color_quad_u8 c0 = dxt1_block::unpack_color(coords.m_low_color, true);
        color_quad_u8 c1 = dxt1_block::unpack_color(coords.m_high_color, true);
        color_quad_u8 c2((c0.r * 2 + c1.r + alternate_rounding) / 3, (c0.g * 2 + c1.g + alternate_rounding) / 3, (c0.b * 2 + c1.b + alternate_rounding) / 3, 0);
        color_quad_u8 c3((c1.r * 2 + c0.r + alternate_rounding) / 3, (c1.g * 2 + c0.g + alternate_rounding) / 3, (c1.b * 2 + c0.b + alternate_rounding) / 3, 0);
        uint64 error = 0;
        unique_color* color = m_evaluated_colors.get_ptr();
        for (uint count = m_evaluated_colors.size(); count; color++, error < m_best_solution.m_error ? count-- : count = 0)
        {
            uint e01 = math::minimum(color::color_distance(true, color->m_color, c0, false), color::color_distance(true, color->m_color, c1, false));
            uint e23 = math::minimum(color::color_distance(true, color->m_color, c2, false), color::color_distance(true, color->m_color, c3, false));
            error += math::minimum(e01, e23) * (uint64)color->m_weight;
        }
        if (error >= m_best_solution.m_error)
        {
            return false;
        }
        m_best_solution.m_coords = coords;
        m_best_solution.m_error = error;
        m_best_solution.m_alpha_block = false;
        m_best_solution.m_alternate_rounding = alternate_rounding;
        m_best_solution.m_enforce_selector = m_best_solution.m_coords.m_low_color == m_best_solution.m_coords.m_high_color;
        if (m_best_solution.m_enforce_selector)
        {
            if ((m_best_solution.m_coords.m_low_color & 31) != 31)
            {
                m_best_solution.m_coords.m_low_color++;
                m_best_solution.m_enforced_selector = 1;
            }
            else
            {
                m_best_solution.m_coords.m_high_color--;
                m_best_solution.m_enforced_selector = 0;
            }
        }
        return true;
    }